

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O2

int ndiGetBXSingleStray(ndicapi *pol,int portHandle,float *outCoord)

{
  float (*pafVar1) [3];
  ulong uVar2;
  
  pafVar1 = pol->BxActiveSingleStrayMarkerPosition;
  uVar2 = 0;
  while( true ) {
    if (pol->BxHandleCount == uVar2) {
      return 1;
    }
    if (pol->BxHandles[uVar2] == portHandle) break;
    uVar2 = uVar2 + 1;
    pafVar1 = pafVar1 + 1;
  }
  if (pol->BxHandleCount == uVar2) {
    return 1;
  }
  outCoord[2] = (*pafVar1)[2];
  *(undefined8 *)outCoord = *(undefined8 *)*pafVar1;
  return 0;
}

Assistant:

ndicapiExport int ndiGetBXSingleStray(ndicapi* pol, int portHandle, float outCoord[3])
{
  int i, n;

  n = pol->BxHandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->BxHandles[i] == portHandle)
    {
      break;
    }
  }
  if (i == n)
  {
    return NDI_DISABLED;
  }

  memcpy(outCoord, pol->BxActiveSingleStrayMarkerPosition[i], sizeof(float) * 3);
  return NDI_OKAY;
}